

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O0

int __thiscall gl4cts::GL40TestPackage::init(GL40TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  Context *pCVar2;
  ClipControlTests *this_00;
  TextureBarrierTests *this_01;
  ExtParameters local_18;
  ExtParameters extParams;
  GL40TestPackage *this_local;
  
  extParams = (ExtParameters)this;
  gl3cts::GL33TestPackage::init(&this->super_GL33TestPackage,ctx);
  glcts::ExtParameters::ExtParameters(&local_18,GLSL_VERSION_400,EXTENSIONTYPE_NONE);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::DrawElementsBaseVertexTests::DrawElementsBaseVertexTests
            ((DrawElementsBaseVertexTests *)pTVar1,pCVar2,&local_18);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  GPUShaderFP64Tests::GPUShaderFP64Tests((GPUShaderFP64Tests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  TextureGatherTests::TextureGatherTests((TextureGatherTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::DrawIndirectTestsGL40::DrawIndirectTestsGL40((DrawIndirectTestsGL40 *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (ClipControlTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  ClipControlTests::ClipControlTests(this_00,pCVar2,API_GL_ARB_clip_control);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  ShaderSubroutineTests::ShaderSubroutineTests((ShaderSubroutineTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (TextureBarrierTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  TextureBarrierTests::TextureBarrierTests(this_01,pCVar2,API_GL_ARB_texture_barrier);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void GL40TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL33TestPackage::init();

	try
	{
		glcts::ExtParameters extParams(glu::GLSL_VERSION_400, glcts::EXTENSIONTYPE_NONE);
		addChild(new glcts::DrawElementsBaseVertexTests(getContext(), extParams));
		addChild(new gl4cts::GPUShaderFP64Tests(getContext()));
		addChild(new gl4cts::TextureGatherTests(getContext()));
		addChild(new glcts::DrawIndirectTestsGL40(getContext()));
		addChild(new gl4cts::ClipControlTests(getContext(), gl4cts::ClipControlTests::API_GL_ARB_clip_control));
		addChild(new gl4cts::ShaderSubroutineTests(getContext()));
		addChild(
			new gl4cts::TextureBarrierTests(getContext(), gl4cts::TextureBarrierTests::API_GL_ARB_texture_barrier));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}